

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createSelectionControlGroup(TestContext *testCtx)

{
  deUint32 *this;
  allocator<float> *paVar1;
  float fVar2;
  float fVar3;
  undefined8 testCtx_00;
  deUint32 seed;
  TestCaseGroup *pTVar4;
  TestNode *pTVar5;
  char *pcVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  mapped_type *this_00;
  Buffer<float> *pBVar10;
  SpvAsmComputeShaderCase *this_01;
  pointer local_4bc;
  int local_4b4;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_4b0;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_4a0;
  string local_490;
  allocator<char> local_469;
  key_type local_468;
  undefined1 local_448 [8];
  ComputeShaderSpec spec;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  specializations;
  size_t caseNdx;
  size_t ndx;
  string local_338;
  CaseParameter local_318;
  allocator<char> local_2e9;
  string local_2e8;
  CaseParameter local_2c8;
  allocator<char> local_299;
  string local_298;
  CaseParameter local_278;
  allocator<char> local_249;
  string local_248;
  CaseParameter local_228;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  StringTemplate shaderTemplate;
  undefined1 local_98 [8];
  vector<float,_std::allocator<float>_> outputFloats;
  undefined1 local_78 [8];
  vector<float,_std::allocator<float>_> inputFloats;
  undefined1 local_58 [4];
  int numElements;
  Random rnd;
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  cases;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"selection_control","Tests selection control cases");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             ((long)&cases.
                     super__Vector_base<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar4
            );
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  ::vector((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
            *)&rnd.m_rnd.z);
  pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pcVar6 = tcu::TestNode::getName(pTVar5);
  seed = deStringHash(pcVar6);
  de::Random::Random((Random *)local_58,seed);
  inputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 100;
  outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<float> *)
           ((long)&outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_78,100,
             (value_type_conflict3 *)
             ((long)&outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&outputFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  shaderTemplate.m_template.field_2._12_4_ = 0;
  paVar1 = (allocator<float> *)(shaderTemplate.m_template.field_2._M_local_buf + 0xb);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_98,100,
             (value_type_conflict3 *)((long)&shaderTemplate.m_template.field_2 + 0xc),paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)(shaderTemplate.m_template.field_2._M_local_buf + 0xb));
  pcVar6 = getComputeAsmShaderPreamble();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,pcVar6,&local_181);
  std::operator+(&local_160,&local_180,
                 "OpSource GLSL 430\nOpName %main \"main\"\nOpName %id \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\n"
                );
  pcVar6 = getComputeAsmInputOutputBufferTraits();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar6,&local_1a9);
  std::operator+(&local_140,&local_160,&local_1a8);
  pcVar6 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar6,&local_1d1);
  std::operator+(&local_120,&local_140,&local_1d0);
  pcVar6 = getComputeAsmInputOutputBuffer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pcVar6,&local_1f9);
  std::operator+(&local_100,&local_120,&local_1f8);
  std::operator+(&local_e0,&local_100,
                 "%id       = OpVariable %uvec3ptr Input\n%zero     = OpConstant %i32 0\n%constf1  = OpConstant %f32 1.0\n%constf10 = OpConstant %f32 10.0\n%main     = OpFunction %void None %voidf\n%entry    = OpLabel\n%idval    = OpLoad %uvec3 %id\n%x        = OpCompositeExtract %u32 %idval 0\n%inloc    = OpAccessChain %f32ptr %indata %zero %x\n%inval    = OpLoad %f32 %inloc\n%outloc   = OpAccessChain %f32ptr %outdata %zero %x\n%cmp_gt   = OpFOrdGreaterThan %bool %inval %constf10\n            OpSelectionMerge %if_end ${CONTROL}\n            OpBranchConditional %cmp_gt %if_true %if_false\n%if_true  = OpLabel\n%addf1    = OpFAdd %f32 %inval %constf1\n            OpStore %outloc %addf1\n            OpBranch %if_end\n%if_false = OpLabel\n%subf1    = OpFSub %f32 %inval %constf1\n            OpStore %outloc %subf1\n            OpBranch %if_end\n%if_end   = OpLabel\n            OpReturn\n            OpFunctionEnd\n"
                );
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"None",&local_249);
  CaseParameter::CaseParameter(&local_228,"none",&local_248);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
               *)&rnd.m_rnd.z,&local_228);
  CaseParameter::~CaseParameter(&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Flatten",&local_299);
  CaseParameter::CaseParameter(&local_278,"flatten",&local_298);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
               *)&rnd.m_rnd.z,&local_278);
  CaseParameter::~CaseParameter(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"DontFlatten",&local_2e9);
  CaseParameter::CaseParameter(&local_2c8,"dont_flatten",&local_2e8);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
               *)&rnd.m_rnd.z,&local_2c8);
  CaseParameter::~CaseParameter(&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"DontFlatten|Flatten",(allocator<char> *)((long)&ndx + 7));
  CaseParameter::CaseParameter(&local_318,"flatten_dont_flatten",&local_338);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  ::push_back((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
               *)&rnd.m_rnd.z,&local_318);
  CaseParameter::~CaseParameter(&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 7));
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_78,0);
  fillRandomScalars<float>((Random *)local_58,-100.0,100.0,pvVar7,100,0);
  floorAll((vector<float,_std::allocator<float>_> *)local_78);
  for (caseNdx = 0; caseNdx < 100; caseNdx = caseNdx + 1) {
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_78,caseNdx);
    fVar2 = *pvVar7;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_78,caseNdx);
    fVar3 = *pvVar7;
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_98,caseNdx);
    *pvVar7 = fVar2 + (float)(~-(uint)(10.0 < fVar3) & 0xbf800000 |
                             -(uint)(10.0 < fVar3) & 0x3f800000);
  }
  specializations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  while( true ) {
    sVar8 = std::
            vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
            ::size((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
                    *)&rnd.m_rnd.z);
    if (sVar8 <= specializations._M_t._M_impl.super__Rb_tree_header._M_node_count) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&spec.verifyIO);
    ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_448);
    pvVar9 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
             ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
                           *)&rnd.m_rnd.z,
                          specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"CONTROL",&local_469);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&spec.verifyIO,&local_468);
    std::__cxx11::string::operator=((string *)this_00,(string *)&pvVar9->param);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    tcu::StringTemplate::specialize
              (&local_490,(StringTemplate *)local_c0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&spec.verifyIO);
    std::__cxx11::string::operator=((string *)local_448,(string *)&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    pBVar10 = (Buffer<float> *)operator_new(0x20);
    Buffer<float>::Buffer(pBVar10,(vector<float,_std::allocator<float>_> *)local_78);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_4a0,(BufferInterface *)pBVar10);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&local_4a0);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_4a0);
    pBVar10 = (Buffer<float> *)operator_new(0x20);
    Buffer<float>::Buffer(pBVar10,(vector<float,_std::allocator<float>_> *)local_98);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_4b0,(BufferInterface *)pBVar10);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)&spec.inputs.
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4b0);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_4b0);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_4bc,100,1,1);
    spec.numWorkGroups.m_data[0] = local_4b4;
    spec.outputs.
    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_4bc;
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    this_01 = (SpvAsmComputeShaderCase *)operator_new(0x140);
    testCtx_00 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data._8_8_;
    this = &rnd.m_rnd.z;
    pvVar9 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
             ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
                           *)this,specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pcVar6 = pvVar9->name;
    pvVar9 = std::
             vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
             ::operator[]((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
                           *)this,specializations._M_t._M_impl.super__Rb_tree_header._M_node_count);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this_01,(TestContext *)testCtx_00,pcVar6,pvVar9->name,(ComputeShaderSpec *)local_448,
               COMPUTE_TEST_USES_NONE);
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
    ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)local_448);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&spec.verifyIO);
    specializations._M_t._M_impl.super__Rb_tree_header._M_node_count =
         specializations._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_c0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_98);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_78);
  de::Random::~Random((Random *)local_58);
  std::
  vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
  ::~vector((vector<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter,_std::allocator<vkt::SpirVAssembly::(anonymous_namespace)::CaseParameter>_>
             *)&rnd.m_rnd.z);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createSelectionControlGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "selection_control", "Tests selection control cases"));
	vector<CaseParameter>			cases;
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 100;
	vector<float>					inputFloats		(numElements, 0);
	vector<float>					outputFloats	(numElements, 0);
	const StringTemplate			shaderTemplate	(
		string(getComputeAsmShaderPreamble()) +

		"OpSource GLSL 430\n"
		"OpName %main \"main\"\n"
		"OpName %id \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		+ string(getComputeAsmInputOutputBufferTraits()) + string(getComputeAsmCommonTypes()) + string(getComputeAsmInputOutputBuffer()) +

		"%id       = OpVariable %uvec3ptr Input\n"
		"%zero     = OpConstant %i32 0\n"
		"%constf1  = OpConstant %f32 1.0\n"
		"%constf10 = OpConstant %f32 10.0\n"

		"%main     = OpFunction %void None %voidf\n"
		"%entry    = OpLabel\n"
		"%idval    = OpLoad %uvec3 %id\n"
		"%x        = OpCompositeExtract %u32 %idval 0\n"
		"%inloc    = OpAccessChain %f32ptr %indata %zero %x\n"
		"%inval    = OpLoad %f32 %inloc\n"
		"%outloc   = OpAccessChain %f32ptr %outdata %zero %x\n"
		"%cmp_gt   = OpFOrdGreaterThan %bool %inval %constf10\n"

		"            OpSelectionMerge %if_end ${CONTROL}\n"
		"            OpBranchConditional %cmp_gt %if_true %if_false\n"
		"%if_true  = OpLabel\n"
		"%addf1    = OpFAdd %f32 %inval %constf1\n"
		"            OpStore %outloc %addf1\n"
		"            OpBranch %if_end\n"
		"%if_false = OpLabel\n"
		"%subf1    = OpFSub %f32 %inval %constf1\n"
		"            OpStore %outloc %subf1\n"
		"            OpBranch %if_end\n"
		"%if_end   = OpLabel\n"
		"            OpReturn\n"
		"            OpFunctionEnd\n");

	cases.push_back(CaseParameter("none",					"None"));
	cases.push_back(CaseParameter("flatten",				"Flatten"));
	cases.push_back(CaseParameter("dont_flatten",			"DontFlatten"));
	cases.push_back(CaseParameter("flatten_dont_flatten",	"DontFlatten|Flatten"));

	fillRandomScalars(rnd, -100.f, 100.f, &inputFloats[0], numElements);

	// CPU might not use the same rounding mode as the GPU. Use whole numbers to avoid rounding differences.
	floorAll(inputFloats);

	for (size_t ndx = 0; ndx < numElements; ++ndx)
		outputFloats[ndx] = inputFloats[ndx] + (inputFloats[ndx] > 10.f ? 1.f : -1.f);

	for (size_t caseNdx = 0; caseNdx < cases.size(); ++caseNdx)
	{
		map<string, string>		specializations;
		ComputeShaderSpec		spec;

		specializations["CONTROL"] = cases[caseNdx].param;
		spec.assembly = shaderTemplate.specialize(specializations);
		spec.inputs.push_back(BufferSp(new Float32Buffer(inputFloats)));
		spec.outputs.push_back(BufferSp(new Float32Buffer(outputFloats)));
		spec.numWorkGroups = IVec3(numElements, 1, 1);

		group->addChild(new SpvAsmComputeShaderCase(testCtx, cases[caseNdx].name, cases[caseNdx].name, spec));
	}

	return group.release();
}